

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

IdList * sqlite3IdListDup(sqlite3 *db,IdList *p)

{
  char *pcVar1;
  IdList_item *pOldItem;
  IdList_item *pNewItem;
  int i;
  IdList *pNew;
  IdList *p_local;
  sqlite3 *db_local;
  
  if (p == (IdList *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local = (sqlite3 *)sqlite3DbMallocRawNN(db,(long)(p->nId + -1) * 0x10 + 0x18);
    if (db_local == (sqlite3 *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      *(int *)&db_local->pVfs = p->nId;
      *(u8 *)((long)&db_local->pVfs + 4) = p->eU4;
      for (pNewItem._4_4_ = 0; pNewItem._4_4_ < p->nId; pNewItem._4_4_ = pNewItem._4_4_ + 1) {
        pcVar1 = sqlite3DbStrDup(db,p->a[pNewItem._4_4_].zName);
        *(char **)(db_local->aLimit + (long)pNewItem._4_4_ * 4 + -0x20) = pcVar1;
        *(anon_union_8_2_31f25709_for_u4 *)(db_local->aLimit + (long)pNewItem._4_4_ * 4 + -0x20 + 2)
             = p->a[pNewItem._4_4_].u4;
      }
    }
  }
  return (IdList *)db_local;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListDup(sqlite3 *db, const IdList *p){
  IdList *pNew;
  int i;
  assert( db!=0 );
  if( p==0 ) return 0;
  assert( p->eU4!=EU4_EXPR );
  pNew = sqlite3DbMallocRawNN(db, sizeof(*pNew)+(p->nId-1)*sizeof(p->a[0]) );
  if( pNew==0 ) return 0;
  pNew->nId = p->nId;
  pNew->eU4 = p->eU4;
  for(i=0; i<p->nId; i++){
    struct IdList_item *pNewItem = &pNew->a[i];
    const struct IdList_item *pOldItem = &p->a[i];
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->u4 = pOldItem->u4;
  }
  return pNew;
}